

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactSurfaceMesh::SurfaceRemoveCollisionModelsFromSystem
          (ChContactSurfaceMesh *this,ChSystem *msys)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  pointer psVar4;
  pointer psVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (msys != (ChSystem *)0x0) {
    psVar4 = (this->vfaces).
             super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->vfaces).
        super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar4) {
      uVar6 = 0;
      uVar7 = 1;
      do {
        peVar1 = (msys->collision_system).
                 super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var2 = (msys->collision_system).
                 super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
            psVar4 = (this->vfaces).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        (*peVar1->_vptr_ChCollisionSystem[5])
                  (peVar1,(psVar4[uVar6].
                           super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->collision_model);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        psVar4 = (this->vfaces).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar7 < (ulong)((long)(this->vfaces).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4
                               );
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar3);
    }
    psVar5 = (this->vfaces_rot).
             super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->vfaces_rot).
        super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar5) {
      uVar6 = 0;
      uVar7 = 1;
      do {
        peVar1 = (msys->collision_system).
                 super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var2 = (msys->collision_system).
                 super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
            psVar5 = (this->vfaces_rot).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        (*peVar1->_vptr_ChCollisionSystem[5])
                  (peVar1,(psVar5[uVar6].
                           super___shared_ptr<chrono::fea::ChContactTriangleXYZROT,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->collision_model);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        psVar5 = (this->vfaces_rot).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar7 < (ulong)((long)(this->vfaces_rot).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4
                               );
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar3);
    }
    return;
  }
  __assert_fail("msys",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChContactSurfaceMesh.cpp"
                ,0x4ff,
                "virtual void chrono::fea::ChContactSurfaceMesh::SurfaceRemoveCollisionModelsFromSystem(ChSystem *)"
               );
}

Assistant:

void ChContactSurfaceMesh::SurfaceRemoveCollisionModelsFromSystem(ChSystem* msys) {
    assert(msys);
    for (unsigned int j = 0; j < vfaces.size(); j++) {
        msys->GetCollisionSystem()->Remove(vfaces[j]->GetCollisionModel());
    }
    for (unsigned int j = 0; j < vfaces_rot.size(); j++) {
        msys->GetCollisionSystem()->Remove(vfaces_rot[j]->GetCollisionModel());
    }
}